

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDVertex::EdgeArrayIndex(ON_SubDVertex *this,ON_SubDEdge *edge)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  uVar1 = 0xffffffff;
  uVar3 = uVar1;
  if ((edge != (ON_SubDEdge *)0x0) && (this->m_edge_count != 0)) {
    if (this->m_edges == (ON_SubDEdgePtr *)0x0) {
      ON_SubDIncrementErrorCount();
    }
    else {
      lVar2 = 0;
      while ((uVar3 = uVar1, (uint)this->m_edge_count != (uint)lVar2 &&
             (uVar3 = (uint)lVar2,
             (ON_SubDEdge *)(this->m_edges[lVar2].m_ptr & 0xfffffffffffffff8) != edge))) {
        lVar2 = lVar2 + 1;
      }
    }
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDVertex::EdgeArrayIndex(
  const ON_SubDEdge* edge
  ) const
{
  if ( nullptr == edge )
    return ON_UNSET_UINT_INDEX;
  const unsigned int edge_count = m_edge_count;
  if ( 0 == edge_count)
    return ON_UNSET_UINT_INDEX;
  const ON_SubDEdgePtr* eptr = m_edges;
  if ( nullptr == eptr)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_UINT_INDEX);

  for ( unsigned int i = 0; i < edge_count; i++, eptr++)
  {
    if (edge == ON_SUBD_EDGE_POINTER(eptr->m_ptr))
      return i;
  }

  return ON_UNSET_UINT_INDEX;
}